

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.hpp
# Opt level: O2

Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 rc::shrinkable::
 filter<std::__cxx11::string,rapidCheck_propImpl_Bech32TestRC_stringsTooShortAreRejected()::__0_const&>
           (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *shrinkable,anon_class_1_0_00000001_for_m_predicate *pred)

{
  IShrinkableImpl *pIVar1;
  IShrinkableImpl *pIVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  MVar4;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40 [8];
  ulong local_38;
  
  (**(code **)**(undefined8 **)pred)(local_40);
  std::__cxx11::string::~string(local_40);
  if (local_38 < 8) {
    pIVar1 = *(IShrinkableImpl **)pred;
    *(undefined8 *)pred = 0;
    local_50.m_impl = (IShrinkableImpl *)0x0;
    local_58.m_impl = pIVar1;
    pIVar2 = (IShrinkableImpl *)operator_new(0x20);
    pIVar2->_vptr_IShrinkableImpl = (_func_int **)&PTR_value_001a4ea0;
    local_58.m_impl = (IShrinkableImpl *)0x0;
    pIVar2[2]._vptr_IShrinkableImpl = (_func_int **)pIVar1;
    local_48.m_impl = (IShrinkableImpl *)0x0;
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Shrinkable(&local_48);
    pIVar2[3]._vptr_IShrinkableImpl = (_func_int **)0x1;
    local_50.m_impl = pIVar2;
    Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Maybe((Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)shrinkable,&local_50);
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Shrinkable(&local_50);
    Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Shrinkable(&local_58);
    uVar3 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)&shrinkable[1].m_impl = 0;
    uVar3 = extraout_RDX;
  }
  MVar4._8_8_ = uVar3;
  MVar4.m_storage = (Storage)shrinkable;
  return MVar4;
}

Assistant:

Maybe<Shrinkable<T>> filter(Shrinkable<T> shrinkable, Predicate &&pred) {
  if (!pred(shrinkable.value())) {
    return Nothing;
  }

  return shrinkable::mapShrinks(
      std::move(shrinkable),
      [=](Seq<Shrinkable<T>> &&shrinks) {
        return seq::mapMaybe(std::move(shrinks),
                             [=](Shrinkable<T> &&shrink) {
                               return shrinkable::filter(std::move(shrink),
                                                         pred);
                             });
      });
}